

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Material::Material(Material *this,Material *param_1)

{
  Material *param_1_local;
  Material *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->emissiveFactor,&param_1->emissiveFactor);
  std::__cxx11::string::string((string *)&this->alphaMode,(string *)&param_1->alphaMode);
  this->alphaCutoff = param_1->alphaCutoff;
  this->doubleSided = param_1->doubleSided;
  std::vector<int,_std::allocator<int>_>::vector(&this->lods,&param_1->lods);
  PbrMetallicRoughness::PbrMetallicRoughness
            (&this->pbrMetallicRoughness,&param_1->pbrMetallicRoughness);
  NormalTextureInfo::NormalTextureInfo(&this->normalTexture,&param_1->normalTexture);
  OcclusionTextureInfo::OcclusionTextureInfo(&this->occlusionTexture,&param_1->occlusionTexture);
  TextureInfo::TextureInfo(&this->emissiveTexture,&param_1->emissiveTexture);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
  ::map(&this->values,&param_1->values);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
  ::map(&this->additionalValues,&param_1->additionalValues);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&param_1->extensions);
  Value::Value(&this->extras,&param_1->extras);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

Material() = default;